

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O0

void __thiscall BibIndexer::completeIndex(BibIndexer *this)

{
  TSNode rootNode_00;
  TSNode rootNode_01;
  undefined1 local_38 [8];
  TSNode rootNode;
  TSTree *tree;
  BibIndexer *this_local;
  
  clearCached(this);
  if (this->file == (File *)0x0) {
    __assert_fail("file != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/biber/BibIndexer.cpp"
                  ,0x52,"void BibIndexer::completeIndex()");
  }
  rootNode.tree = File::getParseTree(this->file);
  if (rootNode.tree != (TSTree *)0x0) {
    ts_tree_root_node((TSNode *)local_38,rootNode.tree);
    rootNode_00.context[2] = rootNode.context[0];
    rootNode_00.context[3] = rootNode.context[1];
    rootNode_00.context[0] = local_38._0_4_;
    rootNode_00.context[1] = local_38._4_4_;
    rootNode_00.id = (void *)rootNode.context._8_8_;
    rootNode_00.tree = (TSTree *)rootNode.id;
    lintErrors(this,rootNode_00);
    rootNode_01.context[2] = rootNode.context[0];
    rootNode_01.context[3] = rootNode.context[1];
    rootNode_01.context[0] = local_38._0_4_;
    rootNode_01.context[1] = local_38._4_4_;
    rootNode_01.id = (void *)rootNode.context._8_8_;
    rootNode_01.tree = (TSTree *)rootNode.id;
    lintFile(this,rootNode_01);
    publishErrors(this);
    return;
  }
  __assert_fail("tree != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/biber/BibIndexer.cpp"
                ,0x55,"void BibIndexer::completeIndex()");
}

Assistant:

void BibIndexer::completeIndex () {
    clearCached();
    assert (file != nullptr);

    const TSTree *tree = file->getParseTree();
    assert (tree != nullptr);

    TSNode rootNode = ts_tree_root_node(tree);

    lintErrors(rootNode);

    lintFile(rootNode);

    publishErrors();
}